

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O2

void Ptex::v2_2::(anonymous_namespace)::Apply<float,1>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  float *pfVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  float fVar9;
  
  bVar3 = (k->res).ulog2;
  iVar4 = k->uw;
  pfVar7 = k->kv;
  pfVar6 = (float *)((long)data + ((long)(k->v << (bVar3 & 0x1f)) + (long)k->u) * 4);
  pfVar1 = pfVar6 + (k->vw << (bVar3 & 0x1f));
  pfVar5 = k->ku;
  for (; pfVar6 != pfVar1; pfVar6 = pfVar6 + (1 << (bVar3 & 0x1f))) {
    fVar9 = *pfVar5 * *pfVar6;
    for (lVar8 = 4; (long)iVar4 * 4 != lVar8; lVar8 = lVar8 + 4) {
      fVar9 = fVar9 + *(float *)((long)pfVar6 + lVar8) * *(float *)((long)pfVar5 + lVar8);
    }
    fVar2 = *pfVar7;
    pfVar7 = pfVar7 + 1;
    *result = fVar9 * fVar2 + *result;
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }